

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void compact_float32_suite::fail_array32_float32_invalid_length(void)

{
  value_type input [9];
  decoder decoder;
  undefined4 local_48;
  value local_44;
  uchar local_40 [16];
  decoder local_30;
  
  local_40[0] = 0xcd;
  local_40[1] = '\x03';
  local_40[2] = '\0';
  local_40[3] = '\0';
  local_40[4] = '\0';
  local_40[5] = '\0';
  local_40[6] = '\0';
  local_40[7] = 0x80;
  local_40[8] = '?';
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[9]>
            (&local_30,(uchar (*) [9])local_40);
  local_44 = local_30.current.code;
  local_48 = 3;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::error_invalid_length",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xe12,"void compact_float32_suite::fail_array32_float32_invalid_length()",&local_44,
             &local_48);
  return;
}

Assistant:

void fail_array32_float32_invalid_length()
{
    const value_type input[] = { token::code::array32_float32, 0x03, 0x00, 0x00, 0x00, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::error_invalid_length);
}